

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::date_t>
               (AggregateFunctionSet *fun,LogicalType *type)

{
  LogicalType *in_RCX;
  pointer this;
  vector<duckdb::LogicalType,_true> by_types;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_178;
  undefined **local_160 [37];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  ArgMaxByTypes();
  if (local_178.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_178.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this = local_178.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_start;
    do {
      GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::date_t>
                ((AggregateFunction *)local_160,(duckdb *)this,type,in_RCX);
      std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                 (fun + 0x20),(AggregateFunction *)local_160);
      local_160[0] = &PTR__AggregateFunction_00890e90;
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
      duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_160);
      this = (pointer)((duckdb *)this + 0x18);
    } while (this != local_178.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_178);
  return;
}

Assistant:

void AddArgMinMaxFunctionBy(AggregateFunctionSet &fun, const LogicalType &type) {
	auto by_types = ArgMaxByTypes();
	for (const auto &by_type : by_types) {
#ifndef DUCKDB_SMALLER_BINARY
		fun.AddFunction(GetArgMinMaxFunctionBy<OP, ARG_TYPE>(by_type, type));
#else
		fun.AddFunction(GetArgMinMaxFunctionInternal<OP, string_t, string_t>(by_type, type));
#endif
	}
}